

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O3

int KangarooTwelve_Update(KangarooTwelve_Instance *ktInstance,uchar *input,size_t inLen)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uchar intermediate [32];
  uchar local_58 [40];
  
  if (ktInstance->phase != ABSORBING) {
    return 1;
  }
  uVar2 = ktInstance->queueAbsorbedLen;
  if (ktInstance->blockNumber == 0) {
    sVar3 = inLen & 0xffffffff;
    if (0x2000 - uVar2 <= inLen) {
      sVar3 = (size_t)(0x2000 - uVar2);
    }
    iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,input,sVar3);
    if (iVar1 != 0) {
      return 1;
    }
    input = input + sVar3;
    uVar2 = ktInstance->queueAbsorbedLen + (int)sVar3;
    inLen = inLen - sVar3;
    ktInstance->queueAbsorbedLen = uVar2;
    if (inLen != 0 && uVar2 == 0x2000) {
      local_58[0] = '\x03';
      ktInstance->queueAbsorbedLen = 0;
      ktInstance->blockNumber = 1;
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_58,1);
      if (iVar1 != 0) {
        return 1;
      }
      (ktInstance->finalNode).byteIOIndex = (ktInstance->finalNode).byteIOIndex + 7 & 0xfffffff8;
      goto LAB_00117bdf;
    }
  }
  else if (uVar2 != 0) {
    sVar3 = inLen & 0xffffffff;
    if (0x2000 - uVar2 <= inLen) {
      sVar3 = (size_t)(0x2000 - uVar2);
    }
    iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode,input,sVar3);
    if (iVar1 != 0) {
      return 1;
    }
    input = input + sVar3;
    inLen = inLen - sVar3;
    uVar2 = ktInstance->queueAbsorbedLen + (int)sVar3;
    ktInstance->queueAbsorbedLen = uVar2;
    if (uVar2 == 0x2000) {
      ktInstance->queueAbsorbedLen = 0;
      ktInstance->blockNumber = ktInstance->blockNumber + 1;
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode,'\v');
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode,local_58,0x20);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_58,0x20);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  if (inLen == 0) {
    return 0;
  }
LAB_00117bdf:
  do {
    sVar3 = 0x2000;
    if (inLen < 0x2000) {
      sVar3 = inLen;
    }
    iVar1 = KeccakWidth1600_12rounds_SpongeInitialize(&ktInstance->queueNode,0x540,0x100);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode,input,sVar3);
    if (iVar1 != 0) {
      return 1;
    }
    if (inLen < 0x2000) {
      ktInstance->queueAbsorbedLen = (uint)sVar3;
    }
    else {
      ktInstance->blockNumber = ktInstance->blockNumber + 1;
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode,'\v');
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode,local_58,0x20);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_58,0x20);
      if (iVar1 != 0) {
        return 1;
      }
    }
    input = input + sVar3;
    inLen = inLen - sVar3;
    if (inLen == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int KangarooTwelve_Update(KangarooTwelve_Instance *ktInstance, const unsigned char *input, size_t inLen)
{
    if (ktInstance->phase != ABSORBING)
        return 1;

    if ( ktInstance->blockNumber == 0 ) {
        /* First block, absorb in final node */
        unsigned int len = (inLen < (chunkSize - ktInstance->queueAbsorbedLen)) ? inLen : (chunkSize - ktInstance->queueAbsorbedLen);
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        ktInstance->queueAbsorbedLen += len;
        if ( (ktInstance->queueAbsorbedLen == chunkSize) && (inLen != 0) ) {
            /* First block complete and more input data available, finalize it */
            const unsigned char padding = 0x03; /* '110^6': message hop, simple padding */
            ktInstance->queueAbsorbedLen = 0;
            ktInstance->blockNumber = 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, &padding, 1) != 0)
                return 1;
            ktInstance->finalNode.byteIOIndex = (ktInstance->finalNode.byteIOIndex + 7) & ~7; /* Zero padding up to 64 bits */
        }
    }
    else if ( ktInstance->queueAbsorbedLen != 0 ) {
        /* There is data in the queue, absorb further in queue until block complete */
        unsigned int len = (inLen < (chunkSize - ktInstance->queueAbsorbedLen)) ? inLen : (chunkSize - ktInstance->queueAbsorbedLen);
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        ktInstance->queueAbsorbedLen += len;
        if ( ktInstance->queueAbsorbedLen == chunkSize ) {
            unsigned char intermediate[capacityInBytes];
            ktInstance->queueAbsorbedLen = 0;
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
    }

    #if defined(KeccakP1600times8_implementation) && !defined(KeccakP1600times8_isFallback)
    #if defined(KeccakP1600times8_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 8 )
    #else
    ParallelSpongeLoop( 8 )
    #endif
    #endif

    #if defined(KeccakP1600times4_implementation) && !defined(KeccakP1600times4_isFallback)
    #if defined(KeccakP1600times4_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 4 )
    #else
    ParallelSpongeLoop( 4 )
    #endif
    #endif

    #if defined(KeccakP1600times2_implementation) && !defined(KeccakP1600times2_isFallback)
    #if defined(KeccakP1600times2_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 2 )
    #else
    ParallelSpongeLoop( 2 )
    #endif
    #endif

    while ( inLen > 0 ) {
        unsigned int len = (inLen < chunkSize) ? inLen : chunkSize;
        if (KeccakWidth1600_12rounds_SpongeInitialize(&ktInstance->queueNode, rate, capacity) != 0)
            return 1;
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        if ( len == chunkSize ) {
            unsigned char intermediate[capacityInBytes];
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
        else
            ktInstance->queueAbsorbedLen = len;
    }

    return 0;
}